

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::ViewportArray::ViewportIndexSubroutine::iterate(ViewportIndexSubroutine *this)

{
  uint uVar1;
  NotSupportedError *this_00;
  
  uVar1 = (*((this->super_DrawTestBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[2])();
  if ((uVar1 & 0x300) == 0x100) {
    DrawTestBase::iterate(&this->super_DrawTestBase);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Subroutines not supported",fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0xe31);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ViewportIndexSubroutine::iterate()
{
	/* this exists solely to check for subroutine support, which is not supported in ES.
	   The real work is done in DrawTestBase::iterate() */
	const glu::ContextType& context_type = m_context.getRenderContext().getType();
	if (!glu::isContextTypeGLCore(context_type))
	{
		throw tcu::NotSupportedError("Subroutines not supported", "", __FILE__, __LINE__);
	}

	return DrawTestBase::iterate();
}